

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O3

int lib::table::Remove(State *state)

{
  bool bVar1;
  int iVar2;
  Table *this;
  size_t index;
  double dVar3;
  StackAPI api;
  StackAPI SStack_28;
  
  luna::StackAPI::StackAPI(&SStack_28,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT>
                    (&SStack_28,1,ValueT_Table,ValueT_Number);
  iVar2 = 0;
  if (bVar1) {
    bVar1 = false;
    this = luna::StackAPI::GetTable(&SStack_28,0);
    index = luna::Table::ArraySize(this);
    if (index != 0) {
      iVar2 = luna::StackAPI::GetStackSize(&SStack_28);
      if (1 < iVar2) {
        dVar3 = luna::StackAPI::GetNumber(&SStack_28,1);
        index = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
      }
      bVar1 = luna::Table::EraseArrayValue(this,index);
    }
    luna::StackAPI::PushBool(&SStack_28,bVar1);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Remove(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_Table, luna::ValueT_Number))
            return 0;

        auto table = api.GetTable(0);
        auto index = table->ArraySize();

        // There is no elements in array of table.
        if (index == 0)
        {
            api.PushBool(false);
            return 1;
        }

        auto params = api.GetStackSize();
        if (params > 1)
            index = static_cast<decltype(index)>(api.GetNumber(1));

        api.PushBool(table->EraseArrayValue(index));
        return 1;
    }